

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  reference puVar6;
  long in_RSI;
  int in_EDI;
  unsigned_long n;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  HuffmanException *e_3;
  exception *e_4;
  HuffmanException *e_1;
  exception *e_2;
  HuffmanArchiver h;
  exception *e;
  ofstream cout;
  ifstream cin;
  string file_out;
  string file_in;
  string cmd;
  bool f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> info;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff928;
  HuffmanArchiver *in_stack_fffffffffffff930;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff938;
  ostream *in_stack_fffffffffffff940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  HuffmanArchiver *in_stack_fffffffffffff978;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5f0;
  undefined1 *local_5e8;
  undefined1 local_549;
  string local_548 [39];
  undefined1 local_521;
  ostream *in_stack_fffffffffffffae0;
  istream *in_stack_fffffffffffffae8;
  HuffmanArchiver *in_stack_fffffffffffffaf0;
  long local_500 [20];
  ostream *in_stack_fffffffffffffba0;
  istream *in_stack_fffffffffffffba8;
  HuffmanArchiver *in_stack_fffffffffffffbb0;
  long local_300 [65];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  byte local_39;
  undefined4 local_38;
  undefined1 local_28 [24];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1185ae);
  if (local_8 < 6) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Not enough arquments, need 6!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_38 = 1;
    goto LAB_00119238;
  }
  local_39 = 0;
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar1,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (bVar2) {
    std::__cxx11::string::operator=(local_88,*(char **)(local_10 + 0x18));
    pcVar1 = *(char **)(local_10 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,pcVar1,&local_f1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    if (bVar2) {
      std::__cxx11::string::operator=(local_a8,*(char **)(local_10 + 0x28));
    }
    else {
      local_39 = 1;
    }
  }
  else {
    local_39 = 1;
  }
  if ((local_39 & 1) == 0) {
    std::ifstream::ifstream(local_300);
    std::ofstream::ofstream(local_500);
    std::ifstream::open(local_300,local_88,8);
    std::ofstream::open(local_500,local_a8,0x10);
    bVar3 = std::ios::operator!((ios *)((long)local_300 + *(long *)(local_300[0] + -0x18)));
    if ((bVar3 & 1) != 0) {
      local_521 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      std::runtime_error::runtime_error(prVar5,(string *)&stack0xfffffffffffffae0);
      local_521 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = std::ios::operator!((ios *)((long)local_500 + *(long *)(local_500[0] + -0x18)));
    if ((bVar3 & 1) != 0) {
      local_549 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      std::runtime_error::runtime_error(prVar5,local_548);
      local_549 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    HuffmanArchiver::HuffmanArchiver(in_stack_fffffffffffff930);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928);
    if (bVar2) {
      HuffmanArchiver::zip
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
LAB_00119079:
      HuffmanArchiver::info(in_stack_fffffffffffff978);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff940,
                 in_stack_fffffffffffff938);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff940)
      ;
      local_5e8 = local_28;
      local_5f0._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_fffffffffffff928);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffff928);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffff930,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffff928), bVar2) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_5f0);
        in_stack_fffffffffffff928 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::ostream::operator<<(&std::cout,*puVar6);
        std::ostream::operator<<(in_stack_fffffffffffff928,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_5f0);
      }
      std::ifstream::close();
      std::ofstream::close();
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928);
      if (bVar2) {
        HuffmanArchiver::unzip
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
        goto LAB_00119079;
      }
      in_stack_fffffffffffff940 = std::operator<<((ostream *)&std::cout,"Unknown command \'");
      poVar4 = std::operator<<(in_stack_fffffffffffff940,local_60);
      poVar4 = std::operator<<(poVar4,"\'!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_4 = 0;
    local_38 = 1;
    HuffmanArchiver::~HuffmanArchiver((HuffmanArchiver *)0x11919d);
    std::ofstream::~ofstream(local_500);
    std::ifstream::~ifstream(local_300);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Invalid arguments!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_38 = 1;
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
LAB_00119238:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff940);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    std::vector<std::size_t> info;
    if (argc < 6) {
        std::cout << "Not enough arquments, need 6!" << std::endl;
        return 0;
    }

    bool f = false;
    std::string cmd = argv[1], file_in, file_out;
    if (std::string(argv[2]) == "-f") {
        file_in = argv[3];
        if (std::string(argv[4]) == "-o") {
            file_out = argv[5];
        } else {
            f = true;
        }
    } else {
        f = true;
    }

    if (f) {
        std::cout << "Invalid arguments!" << std::endl;
        return 0;
    }
    std::ifstream cin;
    std::ofstream cout;

    try {
        cin.open(file_in);
        cout.open(file_out);
        if (!cin) {
            throw std::runtime_error("Could not open file " + file_in);
        }
        if (!cout) {
            throw std::runtime_error("Could not open file " + file_out);
        }
    } catch (std::exception &e) {
        std::cout << e.what() << "!\n";
        return 0;
    }

    HuffmanArchiver h;
    if (cmd == "-c") {
        try {
            h.zip(cin, cout);
        } catch (HuffmanException &e) {
            std::cout << e.what() << std::endl;
            return 0;
        } catch (std::exception &e) {
            std::cout << "Standart exception: " << e.what() << std::endl;
            return 0;
        }
    } else if (cmd == "-u") {
        try {
            h.unzip(cin, cout);
        } catch (HuffmanException &e) {
            std::cout << e.what() << std::endl;
            return 0;
        } catch (std::exception &e) {
            std::cout << "Standart exception: " << e.what() << std::endl;
            return 0;
        }
    } else {
        std::cout << "Unknown command '"<< cmd << "'!" << std::endl;
        return 0;
    }

    info = h.info();
    for (auto n : info) {
        std::cout << n << std::endl;
    }
    cin.close();
    cout.close();
    return 0;
}